

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O3

void printSIMDType10Operand(MCInst *MI,uint OpNo,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  MCOperand *op;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined4 in_register_00000034;
  
  op = MCInst_getOperand(MI,1);
  uVar3 = MCOperand_getImm(op);
  uVar5 = (long)(char)uVar3 & 0xff00000000000000;
  uVar4 = uVar5 | 0xff000000000000;
  if ((uVar3 & 0x40) == 0) {
    uVar4 = uVar5;
  }
  uVar5 = uVar4 | 0xff0000000000;
  if ((uVar3 & 0x20) == 0) {
    uVar5 = uVar4;
  }
  uVar4 = uVar5 | 0xff00000000;
  if ((uVar3 & 0x10) == 0) {
    uVar4 = uVar5;
  }
  uVar5 = uVar4 | 0xff000000;
  if ((uVar3 & 8) == 0) {
    uVar5 = uVar4;
  }
  uVar4 = uVar5 | 0xff0000;
  if ((uVar3 & 4) == 0) {
    uVar4 = uVar5;
  }
  uVar5 = uVar4 | 0xff00;
  if ((uVar3 & 2) == 0) {
    uVar5 = uVar4;
  }
  uVar4 = uVar5 | 0xff;
  if ((uVar3 & 1) == 0) {
    uVar4 = uVar5;
  }
  SStream_concat((SStream *)CONCAT44(in_register_00000034,OpNo),"#%#016llx",uVar4);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar2 = MI->flat_insn->detail;
    *(long *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
         (long)(int)uVar4;
    puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

static void printSIMDType10Operand(MCInst *MI, unsigned OpNo, SStream *O)
{
	uint8_t RawVal = (uint8_t)MCOperand_getImm(MCInst_getOperand(MI, OpNo));
	uint64_t Val = AArch64_AM_decodeAdvSIMDModImmType10(RawVal);
	SStream_concat(O, "#%#016llx", Val);
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = (int)Val;
		MI->flat_insn->detail->arm64.op_count++;
	}
}